

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O1

void icetDataReplicationGroupColor(IceTInt color)

{
  int in_EAX;
  IceTVoid *recvbuf;
  IceTInt *processes;
  long lVar1;
  int in_EDI;
  IceTInt size;
  IceTInt num_proc;
  int local_28;
  int local_24;
  
  local_28 = in_EAX;
  local_24 = in_EDI;
  icetGetIntegerv(3,&local_28);
  recvbuf = icetGetStateBuffer(0x1a0,local_28 << 2);
  processes = (IceTInt *)icetGetStateBuffer(0x1a1,local_28 << 2);
  icetCommAllgather(&local_24,1,0x8003,recvbuf);
  if (local_28 < 1) {
    size = 0;
  }
  else {
    lVar1 = 0;
    size = 0;
    do {
      if (*(int *)((long)recvbuf + lVar1 * 4) == local_24) {
        processes[size] = (IceTInt)lVar1;
        size = size + 1;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < local_28);
  }
  icetDataReplicationGroup(size,processes);
  return;
}

Assistant:

void icetDataReplicationGroupColor(IceTInt color)
{
    IceTInt *allcolors;
    IceTInt *mygroup;
    IceTInt num_proc;
    IceTInt i;
    IceTInt size;

    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);

    /* Just grab two buffers that should be not be used now.  We will be
       done with them by the time we return from this function. */
    allcolors = icetGetStateBuffer(ICET_STRATEGY_BUFFER_0,
                                   sizeof(IceTInt)*num_proc);
    mygroup = icetGetStateBuffer(ICET_STRATEGY_BUFFER_1,
                                 sizeof(IceTInt)*num_proc);

    icetCommAllgather(&color, 1, ICET_INT, allcolors);

    size = 0;
    for (i = 0; i < num_proc; i++) {
        if (allcolors[i] == color) {
            mygroup[size] = i;
            size++;
        }
    }

    icetDataReplicationGroup(size, mygroup);
}